

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

QCborValue * __thiscall
QJsonPrivate::Parser::parse(QCborValue *__return_storage_ptr__,Parser *this,QJsonParseError *error)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> *this_00;
  byte *pbVar1;
  undefined4 uVar2;
  QCborContainerPrivate *pQVar3;
  ParseError PVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QCborValue local_60;
  QCborValue local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar5 = (byte *)this->json;
  pbVar1 = (byte *)this->end;
  if ((((3 < (long)pbVar1 - (long)pbVar5) && (*pbVar5 == 0xef)) && (pbVar5[1] == 0xbb)) &&
     (pbVar5[2] == 0xbf)) {
    pbVar5 = pbVar5 + 3;
    this->json = (char *)pbVar5;
  }
  local_48.n = 0;
  local_48.container = (QCborContainerPrivate *)0x0;
  local_48._20_4_ = 0xaaaaaaaa;
  uVar2 = local_48._20_4_;
  local_48.t = Undefined;
  local_48._20_4_ = 0xaaaaaaaa;
  PVar4 = IllegalValue;
  if (pbVar5 < pbVar1) {
    bVar7 = *pbVar5;
    if ((char)bVar7 < '!') {
      bVar8 = true;
      while ((pbVar6 = pbVar5 + 1, bVar7 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar6;
        bVar8 = pbVar6 < pbVar1;
        pbVar5 = pbVar6;
        if ((pbVar6 == pbVar1) || (bVar7 = *pbVar6, ' ' < (char)bVar7)) break;
      }
      if (!bVar8) goto LAB_0014fd7d;
      bVar7 = *pbVar5;
    }
    if (bVar7 == 0x22) {
      pQVar3 = (QCborContainerPrivate *)operator_new(0x40);
      (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      pQVar3->usedData = 0;
      (pQVar3->data).d.d = (Data *)0x0;
      (pQVar3->data).d.ptr = (char *)0x0;
      (pQVar3->data).d.size = 0;
      (pQVar3->elements).d.d = (Data *)0x0;
      (pQVar3->elements).d.ptr = (Element *)0x0;
      (pQVar3->elements).d.size = 0;
      this_00 = &this->container;
      QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(this_00,pQVar3);
      this->json = this->json + 1;
      bVar8 = parseString(this);
      if (bVar8) {
        local_60.container = (this_00->d).ptr;
        (this_00->d).ptr = (QCborContainerPrivate *)0x0;
        local_48.n = 0;
        local_48.t = String;
LAB_0014fe1c:
        pbVar5 = (byte *)this->json;
        pbVar1 = (byte *)this->end;
        local_48.container = local_60.container;
        if (pbVar5 < pbVar1) {
          do {
            bVar7 = *pbVar5;
            if (((' ' < (char)bVar7) || (0x20 < bVar7)) ||
               ((0x100002600U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0)) goto LAB_0014fe5a;
            pbVar5 = pbVar5 + 1;
            this->json = (char *)pbVar5;
          } while (pbVar5 != pbVar1);
        }
        else {
LAB_0014fe5a:
          PVar4 = GarbageAtEnd;
          uVar2 = local_48._20_4_;
          if (pbVar5 < pbVar1) goto LAB_0014fd7d;
        }
        if (error != (QJsonParseError *)0x0) {
          error->offset = 0;
          error->error = NoError;
        }
        __return_storage_ptr__->n = local_48.n;
        __return_storage_ptr__->container = local_60.container;
        __return_storage_ptr__->t = local_48.t;
        goto LAB_0014fdbf;
      }
      pQVar3 = (QCborContainerPrivate *)0x0;
    }
    else {
      local_48._20_4_ = uVar2;
      parseValue(&local_60,this);
      local_48.n = local_60.n;
      local_48.container = local_60.container;
      local_48.t = local_60.t;
      local_48.t = local_60.t;
      pQVar3 = local_60.container;
      if (local_60.t != Undefined) goto LAB_0014fe1c;
    }
  }
  else {
LAB_0014fd7d:
    local_48._20_4_ = uVar2;
    this->lastError = PVar4;
    pQVar3 = local_48.container;
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            (&this->container,(QCborContainerPrivate *)0x0);
  if (error != (QJsonParseError *)0x0) {
    error->offset = *(int *)&this->json - *(int *)&this->head;
    error->error = this->lastError;
  }
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  if (pQVar3 != (QCborContainerPrivate *)0x0) {
    QCborValue::dispose(&local_48);
  }
LAB_0014fdbf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue Parser::parse(QJsonParseError *error)
{
    eatBOM();

    char token;
    QCborValue value;

    if (!eatSpace()) {
        lastError = QJsonParseError::IllegalValue;
        goto error;
    }

    token = *json;
    if (token == Quote) {
        container = new QCborContainerPrivate;
        json++;
        if (!parseString())
            goto error;
        value = QCborContainerPrivate::makeValue(QCborValue::String, 0, container.take(),
                                                 QCborContainerPrivate::MoveContainer);
    } else {
        value = parseValue();
        if (value.isUndefined())
            goto error;
    }

    eatSpace();
    if (json < end) {
        lastError = QJsonParseError::GarbageAtEnd;
        goto error;
    }

    {
        if (error) {
            error->offset = 0;
            error->error = QJsonParseError::NoError;
        }

        return value;
    }

error:
    container.reset();
    if (error) {
        error->offset = json - head;
        error->error  = lastError;
    }
    return QCborValue();
}